

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

int xmlSerializeHexCharRef(char *buf,int val)

{
  bool bVar1;
  int iVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  
  buf[0] = '&';
  buf[1] = '#';
  uVar4 = val & 0xff0000;
  uVar6 = val & 0xff00;
  uVar7 = uVar6;
  if (uVar6 == 0) {
    uVar7 = val;
  }
  iVar9 = 0x10;
  if (uVar4 == 0) {
    iVar9 = (uint)(uVar6 != 0) << 3;
  }
  buf[2] = 'x';
  if (uVar4 != 0) {
    uVar7 = uVar4;
  }
  iVar2 = iVar9 + 4;
  if ((uVar7 & 0xf0f0f0) == 0) {
    iVar2 = iVar9;
  }
  lVar5 = 3;
  do {
    uVar7 = val >> ((byte)iVar2 & 0x1f) & 0xf;
    cVar3 = (char)uVar7;
    cVar8 = cVar3 + '7';
    if (uVar7 < 10) {
      cVar8 = cVar3 + '0';
    }
    buf[lVar5] = cVar8;
    lVar5 = lVar5 + 1;
    bVar1 = 3 < iVar2;
    iVar2 = iVar2 + -4;
  } while (bVar1);
  buf[lVar5] = ';';
  return (int)lVar5 + 1;
}

Assistant:

int
xmlSerializeHexCharRef(char *buf, int val) {
    char *out = buf;
    int shift = 0, bits;

    *out++ = '&';
    *out++ = '#';
    *out++ = 'x';

    bits = val;
    if (bits & 0xFF0000) {
        shift = 16;
        bits &= 0xFF0000;
    } else if (bits & 0x00FF00) {
        shift = 8;
        bits &= 0x00FF00;
    }
    if (bits & 0xF0F0F0) {
        shift += 4;
    }

    do {
        int d = (val >> shift) & 0x0F;

        if (d < 10)
            *out++ = '0' + d;
        else
            *out++ = 'A' + (d - 10);

	shift -= 4;
    } while (shift >= 0);

    *out++ = ';';

    return(out - buf);
}